

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# 460.hpp
# Opt level: O2

void __thiscall njoy::ENDFtk::section::Type<1,_460>::Type(Type<1,_460> *this,Type<1,_460> *param_1)

{
  double dVar1;
  undefined4 uVar2;
  
  uVar2 = *(undefined4 *)
           &(param_1->super_BaseWithoutMT<njoy::ENDFtk::section::Type<1,_460>_>).field_0x4;
  dVar1 = (param_1->super_BaseWithoutMT<njoy::ENDFtk::section::Type<1,_460>_>).atomicWeightRatio_;
  (this->super_BaseWithoutMT<njoy::ENDFtk::section::Type<1,_460>_>).ZA_ =
       (param_1->super_BaseWithoutMT<njoy::ENDFtk::section::Type<1,_460>_>).ZA_;
  *(undefined4 *)&(this->super_BaseWithoutMT<njoy::ENDFtk::section::Type<1,_460>_>).field_0x4 =
       uVar2;
  (this->super_BaseWithoutMT<njoy::ENDFtk::section::Type<1,_460>_>).atomicWeightRatio_ = dVar1;
  std::__detail::__variant::
  _Move_ctor_base<false,_njoy::ENDFtk::section::Type<1,_460>::DiscretePhotons,_njoy::ENDFtk::section::Type<1,_460>::ContinuousPhotons>
  ::_Move_ctor_base((_Move_ctor_base<false,_njoy::ENDFtk::section::Type<1,_460>::DiscretePhotons,_njoy::ENDFtk::section::Type<1,_460>::ContinuousPhotons>
                     *)&this->data_,
                    (_Move_ctor_base<false,_njoy::ENDFtk::section::Type<1,_460>::DiscretePhotons,_njoy::ENDFtk::section::Type<1,_460>::ContinuousPhotons>
                     *)&param_1->data_);
  return;
}

Assistant:

class ENDFTK_PYTHON_EXPORT Type< 1, 460 > : 
    protected BaseWithoutMT< Type< 1, 460 > > {

    friend BaseWithoutMT< Type< 1, 460 > >;

  public:

    #include "ENDFtk/section/1/460/DiscretePhotonMultiplicity.hpp"
    #include "ENDFtk/section/1/460/DiscretePhotons.hpp"
    #include "ENDFtk/section/1/460/ContinuousPhotons.hpp"

    using DelayedPhotonData = std::variant< // LO=1
                                            DiscretePhotons,
                                            // LO=2
                                            ContinuousPhotons >;

  protected:

    /* fields */
    DelayedPhotonData data_;

    /* auxiliary functions */
    #include "ENDFtk/section/1/460/src/readPhotonData.hpp"

  public:

    /* constructor */
    #include "ENDFtk/section/1/460/src/ctor.hpp"

    /* methods */

    /**
     *  @brief Return the representation type for the delayed photon data
     */
    int LO() const { return std::visit( [] ( const auto& v ) -> long
                                           { return v.LO(); },
                                        this->data_ ); }

    /**
     *  @brief Return the representation type for the delayed photon data
     */
    int representation() const { return this->LO(); }

    /**
     *  @brief Return the number of discrete photons
     */
    int NG() const { return std::visit( [] ( const auto& v ) -> long
                                           { return v.NG(); },
                                        this->data_ ); }

    /**
     *  @brief Return the number of discrete photons
     */
    int numberDiscretePhotons() const { return this->NG(); }

    /**
     *  @brief Return the delayed photon data
     */
    const DelayedPhotonData& delayedPhotons() const { return this->data_; }

    /**
     *  @brief Return the number of lines in this MF1/MT460 section
     */
    long NC() const { return 1 + std::visit( [] ( const auto& v ) -> long
                                                { return v.NC(); },
                                             this->data_ ); }

    #include "ENDFtk/section/1/460/src/print.hpp"

    /**
     *  @brief Return the MT number of the section
     */
    static constexpr int sectionNumber(){ return 460; }

    using BaseWithoutMT::MT;
    using BaseWithoutMT::ZA;
    using BaseWithoutMT::targetIdentifier;
    using BaseWithoutMT::AWR;
    using BaseWithoutMT::atomicWeightRatio;
  }